

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O2

void __thiscall kj::_::Mutex::assertLockedByCaller(Mutex *this,Exclusivity exclusivity)

{
  Fault f;
  Fault local_10;
  
  if (exclusivity == SHARED) {
    if ((this->futex & 0x3fffffff) == 0) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                (&local_10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex.c++"
                 ,0xb6,FAILED,"futex & SHARED_COUNT_MASK",
                 "\"Tried to call getAlreadyLocked*() but lock is not held.\"",
                 (char (*) [56])"Tried to call getAlreadyLocked*() but lock is not held.");
      Debug::Fault::fatal(&local_10);
    }
  }
  else if ((exclusivity == EXCLUSIVE) && (-1 < (int)this->futex)) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex.c++"
               ,0xb2,FAILED,"futex & EXCLUSIVE_HELD",
               "\"Tried to call getAlreadyLocked*() but lock is not held.\"",
               (char (*) [56])"Tried to call getAlreadyLocked*() but lock is not held.");
    Debug::Fault::fatal(&local_10);
  }
  return;
}

Assistant:

void Mutex::assertLockedByCaller(Exclusivity exclusivity) {
  switch (exclusivity) {
    case EXCLUSIVE:
      KJ_ASSERT(futex & EXCLUSIVE_HELD,
                "Tried to call getAlreadyLocked*() but lock is not held.");
      break;
    case SHARED:
      KJ_ASSERT(futex & SHARED_COUNT_MASK,
                "Tried to call getAlreadyLocked*() but lock is not held.");
      break;
  }
}